

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O3

GLFWbool chooseEGLConfig(_GLFWctxconfig *ctxconfig,_GLFWfbconfig *desired,EGLConfig *result)

{
  EGLConfig pvVar1;
  int iVar2;
  GLFWbool GVar3;
  EGLConfig *ppvVar4;
  undefined8 *puVar5;
  _GLFWfbconfig *p_Var6;
  uint uVar7;
  size_t __nmemb;
  long lVar8;
  int value_2;
  int nativeCount;
  XVisualInfo vi;
  uint local_b4;
  EGLConfig *local_b0;
  ulong local_a8;
  int local_9c;
  _GLFWfbconfig *local_98;
  _GLFWfbconfig *local_90;
  EGLConfig *local_88;
  _GLFWctxconfig *local_80;
  ulong local_78;
  long lStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_a8 = 0;
  (*_glfw.egl.GetConfigs)(_glfw.egl.display,(EGLConfig *)0x0,0,&local_9c);
  iVar2 = local_9c;
  if ((long)local_9c == 0) {
    uVar7 = 0;
    _glfwInputError(0x10006,"EGL: No EGLConfigs returned");
  }
  else {
    local_90 = desired;
    local_88 = result;
    ppvVar4 = (EGLConfig *)calloc((long)local_9c,8);
    (*_glfw.egl.GetConfigs)(_glfw.egl.display,ppvVar4,iVar2,&local_9c);
    __nmemb = (size_t)local_9c;
    local_98 = (_GLFWfbconfig *)calloc(__nmemb,0x48);
    local_b0 = ppvVar4;
    if (0 < (long)__nmemb) {
      lVar8 = 0;
      local_a8 = 0;
      local_80 = ctxconfig;
      do {
        pvVar1 = ppvVar4[lVar8];
        (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x303f,(EGLint *)&local_78);
        if (((int)local_78 == 0x308e) &&
           ((*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3033,(EGLint *)&local_78),
           (local_78 & 4) != 0)) {
          local_48 = 0;
          uStack_40 = 0;
          local_58 = 0;
          uStack_50 = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78 = 0;
          lStack_70 = 0;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x302e,(EGLint *)&local_b4);
          lStack_70 = (long)(int)local_b4;
          if (lStack_70 != 0) {
            p_Var6 = local_98 + (int)local_a8;
            if ((local_90->transparent != 0) &&
               (puVar5 = (undefined8 *)XGetVisualInfo(_glfw.x11.display,1,&local_78,&local_b4),
               ctxconfig = local_80, puVar5 != (undefined8 *)0x0)) {
              GVar3 = _glfwIsVisualTransparentX11((Visual *)*puVar5);
              p_Var6->transparent = GVar3;
              XFree(puVar5);
              ctxconfig = local_80;
            }
            if (ctxconfig->client == 0x30001) {
              (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_b4);
              uVar7 = local_b4 & 8;
              ppvVar4 = local_b0;
joined_r0x0012a02e:
              local_b0 = ppvVar4;
              if (uVar7 == 0) goto LAB_0012a12d;
            }
            else if (ctxconfig->client == 0x30002) {
              if (ctxconfig->major == 1) {
                (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_b4);
                uVar7 = local_b4 & 1;
                ppvVar4 = local_b0;
              }
              else {
                (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_b4);
                uVar7 = local_b4 & 4;
                ppvVar4 = local_b0;
              }
              goto joined_r0x0012a02e;
            }
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3024,(EGLint *)&local_b4);
            p_Var6->redBits = local_b4;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3023,(EGLint *)&local_b4);
            p_Var6->greenBits = local_b4;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3022,(EGLint *)&local_b4);
            p_Var6->blueBits = local_b4;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3021,(EGLint *)&local_b4);
            p_Var6->alphaBits = local_b4;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3025,(EGLint *)&local_b4);
            p_Var6->depthBits = local_b4;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3026,(EGLint *)&local_b4);
            p_Var6->stencilBits = local_b4;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3031,(EGLint *)&local_b4);
            p_Var6->samples = local_b4;
            p_Var6->doublebuffer = 1;
            p_Var6->handle = (uintptr_t)pvVar1;
            local_a8 = (ulong)((int)local_a8 + 1);
            ppvVar4 = local_b0;
          }
        }
LAB_0012a12d:
        lVar8 = lVar8 + 1;
      } while (lVar8 < local_9c);
    }
    p_Var6 = _glfwChooseFBConfig(local_90,local_98,(uint)local_a8);
    if (p_Var6 != (_GLFWfbconfig *)0x0) {
      *local_88 = (EGLConfig)p_Var6->handle;
    }
    uVar7 = (uint)(p_Var6 != (_GLFWfbconfig *)0x0);
    free(local_b0);
    free(local_98);
  }
  return uVar7;
}

Assistant:

static GLFWbool chooseEGLConfig(const _GLFWctxconfig* ctxconfig,
                                const _GLFWfbconfig* desired,
                                EGLConfig* result)
{
    EGLConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;

    eglGetConfigs(_glfw.egl.display, NULL, 0, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "EGL: No EGLConfigs returned");
        return GLFW_FALSE;
    }

    nativeConfigs = calloc(nativeCount, sizeof(EGLConfig));
    eglGetConfigs(_glfw.egl.display, nativeConfigs, nativeCount, &nativeCount);

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const EGLConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGB(A) EGLConfigs
        if (getEGLConfigAttrib(n, EGL_COLOR_BUFFER_TYPE) != EGL_RGB_BUFFER)
            continue;

        // Only consider window EGLConfigs
        if (!(getEGLConfigAttrib(n, EGL_SURFACE_TYPE) & EGL_WINDOW_BIT))
            continue;

#if defined(_GLFW_X11)
        XVisualInfo vi = {0};

        // Only consider EGLConfigs with associated Visuals
        vi.visualid = getEGLConfigAttrib(n, EGL_NATIVE_VISUAL_ID);
        if (!vi.visualid)
            continue;

        if (desired->transparent)
        {
            int count;
            XVisualInfo* vis = XGetVisualInfo(_glfw.x11.display,
                                              VisualIDMask, &vi,
                                              &count);
            if (vis)
            {
                u->transparent = _glfwIsVisualTransparentX11(vis[0].visual);
                XFree(vis);
            }
        }
#endif // _GLFW_X11

        if (ctxconfig->client == GLFW_OPENGL_ES_API)
        {
            if (ctxconfig->major == 1)
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES_BIT))
                    continue;
            }
            else
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES2_BIT))
                    continue;
            }
        }
        else if (ctxconfig->client == GLFW_OPENGL_API)
        {
            if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_BIT))
                continue;
        }

        u->redBits = getEGLConfigAttrib(n, EGL_RED_SIZE);
        u->greenBits = getEGLConfigAttrib(n, EGL_GREEN_SIZE);
        u->blueBits = getEGLConfigAttrib(n, EGL_BLUE_SIZE);

        u->alphaBits = getEGLConfigAttrib(n, EGL_ALPHA_SIZE);
        u->depthBits = getEGLConfigAttrib(n, EGL_DEPTH_SIZE);
        u->stencilBits = getEGLConfigAttrib(n, EGL_STENCIL_SIZE);

        u->samples = getEGLConfigAttrib(n, EGL_SAMPLES);
        u->doublebuffer = GLFW_TRUE;

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (EGLConfig) closest->handle;

    free(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}